

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Rescale(CPpmd7 *p)

{
  UInt16 UVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined2 uVar4;
  CPpmd7_Context *pCVar5;
  bool bVar6;
  Byte BVar7;
  UInt16 UVar8;
  Byte BVar9;
  Byte BVar10;
  UInt16 UVar11;
  char cVar12;
  ushort uVar13;
  uint uVar14;
  uint newNU;
  CPpmd_State *oldPtr;
  void *pvVar15;
  CPpmd_State *pCVar16;
  CPpmd_State *pCVar17;
  undefined4 local_5a;
  CPpmd_State tmp_2;
  uint n1;
  uint n0;
  uint numStats;
  CPpmd_State *pCStack_40;
  CPpmd_State tmp_1;
  CPpmd_State *s1;
  CPpmd_State *pCStack_30;
  CPpmd_State tmp;
  CPpmd_State *s;
  CPpmd_State *stats;
  uint escFreq;
  uint sumFreq;
  uint adder;
  uint i;
  CPpmd7 *p_local;
  
  oldPtr = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  pCStack_30 = p->FoundState;
  BVar9 = pCStack_30->Symbol;
  BVar10 = pCStack_30->Freq;
  UVar11 = pCStack_30->SuccessorLow;
  UVar1 = pCStack_30->SuccessorHigh;
  for (; pCStack_30 != oldPtr; pCStack_30 = pCStack_30 + -1) {
    BVar7 = pCStack_30[-1].Freq;
    UVar8 = pCStack_30[-1].SuccessorLow;
    pCStack_30->Symbol = pCStack_30[-1].Symbol;
    pCStack_30->Freq = BVar7;
    pCStack_30->SuccessorLow = UVar8;
    pCStack_30->SuccessorHigh = pCStack_30[-1].SuccessorHigh;
  }
  pCStack_30->Symbol = BVar9;
  pCStack_30->Freq = BVar10;
  pCStack_30->SuccessorLow = UVar11;
  pCStack_30->SuccessorHigh = UVar1;
  stats._0_4_ = (uint)p->MinContext->SummFreq - (uint)pCStack_30->Freq;
  pCStack_30->Freq = pCStack_30->Freq + '\x04';
  uVar14 = (uint)(p->OrderFall != 0);
  pCStack_30->Freq = (Byte)(pCStack_30->Freq + uVar14 >> 1);
  uVar13 = (ushort)pCStack_30->Freq;
  sumFreq = p->MinContext->NumStats - 1;
  pCVar16 = pCStack_30;
  do {
    pCStack_30 = pCVar16;
    pCVar16 = pCStack_30 + 1;
    stats._0_4_ = (uint)stats - pCStack_30[1].Freq;
    pCStack_30[1].Freq = (Byte)(pCStack_30[1].Freq + uVar14 >> 1);
    uVar13 = pCStack_30[1].Freq + uVar13;
    if (pCStack_30->Freq < pCStack_30[1].Freq) {
      uVar2 = pCVar16->Symbol;
      uVar3 = pCVar16->Freq;
      uVar4 = pCVar16->SuccessorLow;
      UVar1 = pCStack_30[1].SuccessorHigh;
      pCVar17 = pCVar16;
      do {
        pCStack_40 = pCVar17;
        BVar9 = pCStack_40[-1].Freq;
        UVar11 = pCStack_40[-1].SuccessorLow;
        pCStack_40->Symbol = pCStack_40[-1].Symbol;
        pCStack_40->Freq = BVar9;
        pCStack_40->SuccessorLow = UVar11;
        pCStack_40->SuccessorHigh = pCStack_40[-1].SuccessorHigh;
        pCVar17 = pCStack_40 + -1;
        bVar6 = false;
        if (pCVar17 != oldPtr) {
          bVar6 = pCStack_40[-2].Freq < (byte)uVar3;
        }
      } while (bVar6);
      pCVar17->Symbol = uVar2;
      pCVar17->Freq = uVar3;
      pCVar17->SuccessorLow = uVar4;
      pCStack_40[-1].SuccessorHigh = UVar1;
    }
    sumFreq = sumFreq - 1;
  } while (sumFreq != 0);
  if (pCStack_30[1].Freq == '\0') {
    uVar14 = (uint)p->MinContext->NumStats;
    sumFreq = 0;
    pCStack_30 = pCVar16;
    do {
      sumFreq = sumFreq + 1;
      pCVar16 = pCStack_30 + -1;
      pCStack_30 = pCStack_30 + -1;
    } while (pCVar16->Freq == '\0');
    stats._0_4_ = sumFreq + (uint)stats;
    p->MinContext->NumStats = p->MinContext->NumStats - (short)sumFreq;
    if (p->MinContext->NumStats == 1) {
      local_5a._0_1_ = oldPtr->Symbol;
      local_5a._1_1_ = oldPtr->Freq;
      local_5a._2_2_ = oldPtr->SuccessorLow;
      UVar1 = oldPtr->SuccessorHigh;
      do {
        cVar12 = local_5a._1_1_ - (char)((int)(uint)local_5a._1_1_ >> 1);
        local_5a._0_2_ = CONCAT11(cVar12,(undefined1)local_5a);
        stats._0_4_ = (uint)stats >> 1;
      } while (1 < (uint)stats);
      InsertNode(p,oldPtr,(uint)p->Units2Indx[(uVar14 + 1 >> 1) - 1]);
      pCVar5 = p->MinContext;
      p->FoundState = (CPpmd_State *)&pCVar5->SummFreq;
      *(undefined4 *)&pCVar5->SummFreq = local_5a;
      *(UInt16 *)((long)&pCVar5->Stats + 2) = UVar1;
      return;
    }
    uVar14 = uVar14 + 1 >> 1;
    newNU = (int)(p->MinContext->NumStats + 1) >> 1;
    if (uVar14 != newNU) {
      pvVar15 = ShrinkUnits(p,oldPtr,uVar14,newNU);
      p->MinContext->Stats = (int)pvVar15 - (int)p->Base;
    }
  }
  p->MinContext->SummFreq = (uVar13 + (short)(uint)stats) - (short)((uint)stats >> 1);
  p->FoundState = (CPpmd_State *)(p->Base + p->MinContext->Stats);
  return;
}

Assistant:

static void Rescale(CPpmd7 *p)
{
  unsigned i, adder, sumFreq, escFreq;
  CPpmd_State *stats = STATS(p->MinContext);
  CPpmd_State *s = p->FoundState;
  {
    CPpmd_State tmp = *s;
    for (; s != stats; s--)
      s[0] = s[-1];
    *s = tmp;
  }
  escFreq = p->MinContext->SummFreq - s->Freq;
  s->Freq += 4;
  adder = (p->OrderFall != 0);
  s->Freq = (Byte)((s->Freq + adder) >> 1);
  sumFreq = s->Freq;
  
  i = p->MinContext->NumStats - 1;
  do
  {
    escFreq -= (++s)->Freq;
    s->Freq = (Byte)((s->Freq + adder) >> 1);
    sumFreq += s->Freq;
    if (s[0].Freq > s[-1].Freq)
    {
      CPpmd_State *s1 = s;
      CPpmd_State tmp = *s1;
      do
        s1[0] = s1[-1];
      while (--s1 != stats && tmp.Freq > s1[-1].Freq);
      *s1 = tmp;
    }
  }
  while (--i);
  
  if (s->Freq == 0)
  {
    unsigned numStats = p->MinContext->NumStats;
    unsigned n0, n1;
    do { i++; } while ((--s)->Freq == 0);
    escFreq += i;
    p->MinContext->NumStats = (UInt16)(p->MinContext->NumStats - i);
    if (p->MinContext->NumStats == 1)
    {
      CPpmd_State tmp = *stats;
      do
      {
        tmp.Freq = (Byte)(tmp.Freq - (tmp.Freq >> 1));
        escFreq >>= 1;
      }
      while (escFreq > 1);
      InsertNode(p, stats, U2I(((numStats + 1) >> 1)));
      *(p->FoundState = ONE_STATE(p->MinContext)) = tmp;
      return;
    }
    n0 = (numStats + 1) >> 1;
    n1 = (p->MinContext->NumStats + 1) >> 1;
    if (n0 != n1)
      p->MinContext->Stats = STATS_REF(ShrinkUnits(p, stats, n0, n1));
  }
  p->MinContext->SummFreq = (UInt16)(sumFreq + escFreq - (escFreq >> 1));
  p->FoundState = STATS(p->MinContext);
}